

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalParse
          (CodeGeneratorRequest *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  ArenaImpl *this_00;
  uint uVar5;
  FileDescriptorProto *msg;
  string *s;
  Version *pVVar6;
  char cVar7;
  uint32 res;
  uint tag;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_bool> pVar9;
  
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar9._8_8_ = 0;
      pVar9.first = ptr;
    }
    else {
      pVar9._8_8_ = 1;
      pVar9.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar9 = internal::EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar9.first;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    pVar8.second._0_1_ = bVar1;
    pVar8.first = (char *)(p + 1);
    pVar8._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar8 = internal::ReadTagFallback((char *)p,res);
      }
      else {
        pVar8.second = res;
        pVar8.first = (char *)(p + 2);
        pVar8._12_4_ = 0;
      }
    }
    ptr = pVar8.first;
    if (ptr == (char *)0x0) {
LAB_00270454:
      cVar7 = '\x04';
    }
    else {
      tag = pVar8.second;
      uVar5 = (uint)(pVar8._8_8_ >> 3) & 0x1fffffff;
      cVar7 = (char)pVar8.second;
      if (uVar5 < 3) {
        if (uVar5 == 1) {
          if (cVar7 == '\n') {
            ptr = ptr + -1;
            do {
              pRVar4 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar4 == (Rep *)0x0) {
LAB_0027031d:
                internal::RepeatedPtrFieldBase::Reserve
                          (&(this->file_to_generate_).super_RepeatedPtrFieldBase,
                           (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0027032b:
                pRVar4 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
                pRVar4->allocated_size = pRVar4->allocated_size + 1;
                this_00 = (ArenaImpl *)(this->file_to_generate_).super_RepeatedPtrFieldBase.arena_;
                if (this_00 == (ArenaImpl *)0x0) {
                  s = (string *)operator_new(0x20);
                }
                else {
                  if (this_00[1].initial_block_ != (Block *)0x0) {
                    Arena::OnArenaAllocation
                              ((Arena *)this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                  }
                  s = (string *)
                      internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                (this_00,0x20,internal::arena_destruct_object<std::__cxx11::string>)
                  ;
                }
                (s->_M_dataplus)._M_p = (pointer)&s->field_2;
                s->_M_string_length = 0;
                (s->field_2)._M_local_buf[0] = '\0';
                pRVar4 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
                iVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
                (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                pRVar4->elements[iVar3] = s;
              }
              else {
                iVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
                if (pRVar4->allocated_size <= iVar3) {
                  if (pRVar4->allocated_size ==
                      (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_)
                  goto LAB_0027031d;
                  goto LAB_0027032b;
                }
                (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                s = (string *)pRVar4->elements[iVar3];
              }
              ptr = internal::InlineGreedyStringParser(s,ptr + 1,ctx);
              if (ptr == (char *)0x0) goto LAB_00270454;
              cVar7 = '\x02';
            } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\n'));
            goto LAB_00270449;
          }
          goto LAB_00270405;
        }
        if ((uVar5 != 2) || (cVar7 != '\x12')) goto LAB_00270405;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if ((this->parameter_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this->parameter_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        ptr = internal::InlineGreedyStringParser((this->parameter_).ptr_,ptr,ctx);
      }
      else {
        if (uVar5 == 3) {
          if (cVar7 == '\x1a') {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
            if (this->compiler_version_ == (Version *)0x0) {
              pVVar6 = Arena::CreateMaybeMessage<google::protobuf::compiler::Version>((Arena *)0x0);
              this->compiler_version_ = pVVar6;
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::compiler::Version>
                            (ctx,this->compiler_version_,ptr);
            goto LAB_00270437;
          }
        }
        else if ((uVar5 == 0xf) && (cVar7 == 'z')) {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_00270255:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->proto_file_).super_RepeatedPtrFieldBase,
                         (this->proto_file_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_00270265:
              pRVar4 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                              ((this->proto_file_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
              (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg;
            }
            else {
              iVar3 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->proto_file_).super_RepeatedPtrFieldBase.total_size_) goto LAB_00270255;
                goto LAB_00270265;
              }
              (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (FileDescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::FileDescriptorProto>
                            (ctx,msg,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_00270454;
            cVar7 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 'z'));
          goto LAB_00270449;
        }
LAB_00270405:
        if (tag == 0 || (tag & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
          cVar7 = '\v';
          goto LAB_00270449;
        }
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
      }
LAB_00270437:
      cVar7 = (ptr == (char *)0x0) * '\x02' + '\x02';
    }
LAB_00270449:
    if (cVar7 != '\x02') {
      if (cVar7 == '\x04') {
        ptr = (char *)0x0;
      }
      return ptr;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorRequest::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string file_to_generate = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_file_to_generate(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string parameter = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_parameter(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorRequest.parameter");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_compiler_version(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_proto_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}